

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O2

void __thiscall wirehair::Codec::PeelAvalancheOnSolve(Codec *this,uint16_t column_i)

{
  anon_union_2_3_10dc256e_for_PeelColumn_1 *paVar1;
  PeelRow *row;
  ushort row_i;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  PeelRow *pPVar5;
  PeelColumn *pPVar6;
  uint16_t uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  uint16_t ref_column_i;
  uint uVar11;
  uint16_t uVar12;
  undefined6 in_register_00000032;
  ulong uVar13;
  short sVar14;
  ushort uVar15;
  PeelRefs *pPVar16;
  bool bVar17;
  ulong local_38;
  
  uVar10 = CONCAT62(in_register_00000032,column_i) & 0xffffffff;
  local_38 = CONCAT62(in_register_00000032,column_i) & 0xffffffff;
  uVar12 = this->_peel_col_refs[uVar10].RowCount;
  pPVar16 = this->_peel_col_refs + uVar10;
LAB_00102c8f:
  while( true ) {
    do {
      bVar17 = uVar12 == 0;
      uVar12 = uVar12 - 1;
      if (bVar17) {
        return;
      }
      pPVar16 = (PeelRefs *)pPVar16->Rows;
      pPVar5 = this->_peel_rows;
      row_i = *(ushort *)pPVar16;
      uVar7 = pPVar5[row_i].UnmarkedCount;
      row = pPVar5 + row_i;
      pPVar5[row_i].UnmarkedCount = uVar7 - 1;
      if (uVar7 == 3) goto LAB_00102cf8;
    } while (uVar7 != 2);
    uVar7 = (row->Marks).Unmarked[0];
    if (uVar7 == (uint16_t)local_38) {
      uVar7 = (row->Marks).Unmarked[1];
    }
    if (this->_peel_cols[uVar7].Mark != '\0') break;
    SolveWithPeel(this,row,row_i,uVar7);
  }
  goto LAB_00102da8;
LAB_00102cf8:
  uVar2 = (row->Params).PeelAdd;
  local_38 = (ulong)CONCAT24(row_i,(undefined4)local_38);
  uVar3 = this->_block_count;
  uVar4 = this->_block_next_prime;
  uVar10 = (ulong)(row->Params).PeelFirst;
  uVar15 = 0;
  sVar14 = (row->Params).PeelCount - 1;
  while( true ) {
    pPVar6 = this->_peel_cols;
    uVar9 = uVar10 & 0xffff;
    if (pPVar6[uVar9].Mark == '\0') {
      uVar13 = (ulong)uVar15;
      uVar15 = uVar15 + 1;
      *(short *)((long)&row->Marks + uVar13 * 2) = (short)uVar10;
      paVar1 = &pPVar6[uVar9].field_1;
      paVar1->Weight2Refs = paVar1->Weight2Refs + 1;
    }
    bVar17 = sVar14 == 0;
    sVar14 = sVar14 + -1;
    if (bVar17) break;
    uVar10 = (ulong)((int)uVar9 + (uint)uVar2) % (ulong)uVar4;
    if ((uint)uVar3 <= (uint)uVar10) {
      uVar8 = (uint)uVar4 - (uint)uVar10;
      uVar11 = uVar8 & 0xffff;
      if (uVar2 < (ushort)uVar8) {
        uVar10 = (ulong)((uint)uVar2 * 0x10000 - uVar11) % (ulong)(uint)uVar2;
      }
      else {
        uVar10 = (ulong)(uVar2 - uVar11);
      }
    }
  }
  if (uVar15 < 2) {
    row->UnmarkedCount = 0;
    if (uVar15 == 1) {
      SolveWithPeel(this,row,row_i,(row->Marks).Unmarked[0]);
    }
    else {
LAB_00102da8:
      row->NextRow = this->_defer_head_rows;
      this->_defer_head_rows = row_i;
    }
  }
  goto LAB_00102c8f;
}

Assistant:

void Codec::PeelAvalancheOnSolve(
    uint16_t column_i ///< Column that was solved
)
{
    PeelRefs * GF256_RESTRICT refs = &_peel_col_refs[column_i];
    uint16_t ref_row_count = refs->RowCount;
    uint16_t * GF256_RESTRICT ref_rows = refs->Rows;

    // Walk list of peeled rows referenced by this newly solved column
    while (ref_row_count--)
    {
        // Update unmarked row count for this referenced row
        uint16_t ref_row_i = *ref_rows++;
        PeelRow * GF256_RESTRICT ref_row = &_peel_rows[ref_row_i];
        uint16_t unmarked_count = --ref_row->UnmarkedCount;

        // If row may be solving a column now:
        if (unmarked_count == 1)
        {
            uint16_t new_column_i = ref_row->Marks.Unmarked[0];

            // If that is this column:
            if (new_column_i == column_i) {
                new_column_i = ref_row->Marks.Unmarked[1];
            }

            /*
                Rows that are to be deferred will either end up
                here or below where it handles the case of there
                being no columns unmarked in a row.
            */

            // If column is already solved:
            if (_peel_cols[new_column_i].Mark == MARK_TODO)
            {
                SolveWithPeel(
                    ref_row,
                    ref_row_i,
                    new_column_i);
                continue;
            }

            CAT_IF_DUMP(cout << "PeelAvalancheOnSolve: Deferred(1) with column " <<
                column_i << " at row " << ref_row_i << endl;)

            // Link at head of defer list
            ref_row->NextRow = _defer_head_rows;
            _defer_head_rows = ref_row_i;
        }
        else if (unmarked_count == 2)
        {
            // Regenerate the row columns to discover which are unmarked
            PeelRowIterator ref_iter(ref_row->Params, _block_count, _block_next_prime);

            uint16_t store_count = 0;

            // For each column:
            do
            {
                const uint16_t ref_column_i = ref_iter.GetColumn();

                PeelColumn * GF256_RESTRICT ref_col = &_peel_cols[ref_column_i];

                // If column is unmarked:
                if (ref_col->Mark == MARK_TODO)
                {
                    // Store the two unmarked columns in the row
                    ref_row->Marks.Unmarked[store_count++] = ref_column_i;

                    // Increment weight-2 reference count (cannot hurt even if not true)
                    ref_col->Weight2Refs++;
                }
            } while (ref_iter.Iterate());

            /*
                This is a little subtle, but sometimes the avalanche will
                happen here, and sometimes a row will be marked deferred.
            */

            if (store_count <= 1)
            {
                // Insure that this row won't be processed further during this recursion
                ref_row->UnmarkedCount = 0;

                // If row is to be deferred:
                if (store_count == 1)
                {
                    SolveWithPeel(
                        ref_row,
                        ref_row_i,
                        ref_row->Marks.Unmarked[0]);
                    continue;
                }

                CAT_IF_DUMP(cout << "PeelAvalancheOnSolve: Deferred(2) with column " << column_i << " at row " << ref_row_i << endl;)

                // Link at head of defer list
                ref_row->NextRow = _defer_head_rows;
                _defer_head_rows = ref_row_i;
            }
        }
    }
}